

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  undefined8 uVar1;
  pointer pVVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int unitNdx;
  long lVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  undefined1 auVar10 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Mat3 shrinkScaleMat;
  undefined8 local_78;
  undefined8 uStack_70;
  Matrix<float,_3,_3> local_54;
  
  tcu::Matrix<float,_3,_3>::Matrix(&local_54,makeSafeLods::shrinkScaleMatData);
  fVar19 = 1.0 / (float)viewportSize->m_data[0];
  fVar13 = 1.0 / (float)viewportSize->m_data[1];
  lVar6 = 0;
LAB_00ec0676:
  if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar6) {
    return;
  }
  do {
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(undefined8 *)
             (textureSizes->
             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl
             .super__Vector_impl_data._M_start[lVar6].m_data;
    fVar9 = (float)(int)uVar1;
    fVar11 = (float)(int)((ulong)uVar1 >> 0x20);
    auVar14._0_4_ = pVVar2[lVar6].m_data[0] * fVar9 * fVar19;
    auVar14._4_4_ = pVVar2[lVar6].m_data[2] * fVar11 * fVar19;
    auVar14._8_4_ = fVar19 * 0.0;
    auVar14._12_4_ = fVar19 * 0.0;
    auVar20._0_4_ = pVVar2[lVar6].m_data[1] * fVar9 * fVar13;
    auVar20._4_4_ = pVVar2[lVar6].m_data[3] * fVar11 * fVar13;
    auVar20._8_4_ = fVar13 * 0.0;
    auVar20._12_4_ = fVar13 * 0.0;
    uVar3 = CONCAT44(auVar14._4_4_,auVar14._0_4_);
    auVar10._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar10._8_4_ = -auVar14._8_4_;
    auVar10._12_4_ = -auVar14._12_4_;
    auVar10 = maxps(auVar10,auVar14);
    uVar3 = CONCAT44(auVar20._4_4_,auVar20._0_4_);
    auVar15._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar15._8_4_ = -auVar20._8_4_;
    auVar15._12_4_ = -auVar20._12_4_;
    auVar16 = maxps(auVar15,auVar20);
    uVar7 = -(uint)(auVar16._0_4_ <= auVar10._0_4_);
    uVar8 = -(uint)(auVar16._4_4_ <= auVar10._4_4_);
    fVar9 = deFloatLog2((float)(~uVar8 & (uint)auVar16._4_4_ | (uint)auVar10._4_4_ & uVar8) +
                        (float)(~uVar7 & (uint)auVar16._0_4_ | (uint)auVar10._0_4_ & uVar7));
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(undefined8 *)
             (textureSizes->
             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl
             .super__Vector_impl_data._M_start[lVar6].m_data;
    fVar11 = (float)(int)uVar1;
    fVar12 = (float)(int)((ulong)uVar1 >> 0x20);
    auVar17._0_4_ = pVVar2[lVar6].m_data[0] * fVar11 * fVar19;
    auVar17._4_4_ = pVVar2[lVar6].m_data[2] * fVar12 * fVar19;
    auVar17._8_4_ = fVar19 * 0.0;
    auVar17._12_4_ = fVar19 * 0.0;
    auVar21._0_4_ = pVVar2[lVar6].m_data[1] * fVar11 * fVar13;
    auVar21._4_4_ = pVVar2[lVar6].m_data[3] * fVar12 * fVar13;
    auVar21._8_4_ = fVar13 * 0.0;
    auVar21._12_4_ = fVar13 * 0.0;
    uVar3 = CONCAT44(auVar17._4_4_,auVar17._0_4_);
    auVar16._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar16._8_4_ = -auVar17._8_4_;
    auVar16._12_4_ = -auVar17._12_4_;
    auVar10 = maxps(auVar16,auVar17);
    uVar3 = CONCAT44(auVar21._4_4_,auVar21._0_4_);
    auVar18._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar18._8_4_ = -auVar21._8_4_;
    auVar18._12_4_ = -auVar21._12_4_;
    auVar16 = maxps(auVar18,auVar21);
    uVar7 = -(uint)(auVar16._0_4_ <= auVar10._0_4_);
    uVar8 = -(uint)(auVar16._4_4_ <= auVar10._4_4_);
    fVar11 = (float)(~uVar7 & (uint)auVar16._0_4_ | (uint)auVar10._0_4_ & uVar7);
    fVar12 = (float)(~uVar8 & (uint)auVar16._4_4_ | (uint)auVar10._4_4_ & uVar8);
    uVar7 = -(uint)(fVar12 <= fVar11);
    fVar11 = deFloatLog2((float)(~uVar7 & (uint)fVar12 | (uint)fVar11 & uVar7));
    iVar5 = 0;
    iVar4 = 0;
    if (0.5 <= fVar9 + 0.01) {
      fVar12 = ceilf(fVar9 + 0.01 + 0.5);
      iVar4 = (int)fVar12 + -1;
    }
    if (0.5 <= fVar11 + -0.01) {
      fVar12 = ceilf(fVar11 + -0.01 + 0.5);
      iVar5 = (int)fVar12 + -1;
    }
    fVar12 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar12 = fVar9;
    }
    if (0.1 <= fVar12) {
      if (0.0 < fVar9) {
        fVar12 = floorf(fVar9);
        fVar12 = (fVar9 - fVar12) + -0.5;
        fVar9 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar9 = fVar12;
        }
        if (fVar9 < 0.1) goto LAB_00ec0687;
      }
      fVar9 = -fVar11;
      if (-fVar11 <= fVar11) {
        fVar9 = fVar11;
      }
      if (0.1 <= fVar9) {
        if (0.0 < fVar11) {
          fVar9 = floorf(fVar11);
          fVar11 = (fVar11 - fVar9) + -0.5;
          fVar9 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar9 = fVar11;
          }
          if (fVar9 < 0.1) goto LAB_00ec0687;
        }
        if (iVar4 == iVar5) break;
      }
    }
LAB_00ec0687:
    tcu::operator*((Matrix<float,_3,_3> *)&local_78,&local_54,
                   (this->m_transformations).
                   super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
    tcu::Matrix<float,_3,_3>::operator=
              ((this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6,(Matrix<float,_3,_3> *)&local_78);
    calculateLodDerivateParts
              ((Functional *)&local_78,
               (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar6;
    *(undefined8 *)pVVar2->m_data = local_78;
    *(undefined8 *)(pVVar2->m_data + 2) = uStack_70;
  } while( true );
  lVar6 = lVar6 + 1;
  goto LAB_00ec0676;
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec2>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMatData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	Mat3 shrinkScaleMat(shrinkScaleMatData);

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = shrinkScaleMat * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}